

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

natwm_error workspace_unfocus_client(natwm_state *state,workspace *workspace,client *client)

{
  natwm_error nVar1;
  list *node;
  
  node = workspace->clients;
  do {
    node = (list *)node->head;
    if (node == (list *)0x0) {
      return NOT_FOUND_ERROR;
    }
  } while (client->window != *(xcb_window_t *)node->size);
  if (node->head == (node *)0x0) {
    nVar1 = INVALID_INPUT_ERROR;
  }
  else {
    natwm_state_lock(state);
    if (client->is_focused == true) {
      workspace_focus_client(state,workspace,(client *)node->head->data);
    }
    list_move_node_to_tail(workspace->clients,(node *)node);
    natwm_state_unlock(state);
    nVar1 = NO_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error workspace_unfocus_client(struct natwm_state *state, struct workspace *workspace,
                                          struct client *client)
{
        struct node *client_node = get_client_node_from_client(workspace->clients, client);

        if (client_node == NULL) {
                return NOT_FOUND_ERROR;
        } else if (client_node->next == NULL) {
                return INVALID_INPUT_ERROR;
        }

        natwm_state_lock(state);

        if (client->is_focused) {
                struct node *next_node = client_node->next;
                struct client *next_client = get_client_from_client_node(next_node);

                workspace_focus_client(state, workspace, next_client);
        }

        list_move_node_to_tail(workspace->clients, client_node);

        natwm_state_unlock(state);

        return NO_ERROR;
}